

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_protocol_init(lws_context *context)

{
  ushort uVar1;
  uint in_EAX;
  int iVar2;
  lws_vhost *vh;
  int any;
  undefined8 uStack_28;
  
  vh = context->vhost_list;
  uStack_28 = (ulong)in_EAX;
  if (-1 < (char)*(ushort *)&context->field_0x510) {
    *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 | 0x80;
    _lws_log(8,"%s\n","lws_protocol_init");
    if (vh != (lws_vhost *)0x0) {
      do {
        if ((((vh->field_0x2b4 & 2) == 0) && ((vh->options & 0x2000000) == 0)) &&
           (iVar2 = lws_protocol_init_vhost(vh,(int *)((long)&uStack_28 + 4)), iVar2 != 0)) {
          return 1;
        }
        vh = vh->vhost_next;
      } while (vh != (lws_vhost *)0x0);
    }
    uVar1 = *(ushort *)&context->field_0x510;
    *(ushort *)&context->field_0x510 = uVar1 & 0xff7f;
    if (((uVar1 & 0x40) == 0) && (iVar2 = lws_finalize_startup(context), iVar2 != 0)) {
      return 1;
    }
    context->field_0x510 = context->field_0x510 | 0x40;
    if (uStack_28._4_4_ != 0) {
      lws_tls_check_all_cert_lifetimes(context);
    }
  }
  return 0;
}

Assistant:

int
lws_protocol_init(struct lws_context *context)
{
	struct lws_vhost *vh = context->vhost_list;
	int any = 0;

	if (context->doing_protocol_init)
		return 0;

	context->doing_protocol_init = 1;

	lwsl_info("%s\n", __func__);

	while (vh) {

		/* only do the protocol init once for a given vhost */
		if (vh->created_vhost_protocols ||
		    (lws_check_opt(vh->options, LWS_SERVER_OPTION_SKIP_PROTOCOL_INIT)))
			goto next;

		if (lws_protocol_init_vhost(vh, &any))
			return 1;
next:
		vh = vh->vhost_next;
	}

	context->doing_protocol_init = 0;

	if (!context->protocol_init_done && lws_finalize_startup(context))
		return 1;

	context->protocol_init_done = 1;

#if defined(LWS_WITH_SERVER)
	if (any)
		lws_tls_check_all_cert_lifetimes(context);
#endif

	return 0;
}